

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactSonameImportTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactSonameImportTag> *this,
          cmGeneratorTarget *target,cmGeneratorExpressionContext *context,
          GeneratorExpressionContent *content)

{
  bool bVar1;
  TargetType TVar2;
  _Rb_tree_header *config;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_e8;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  size_type local_40;
  pointer local_38;
  string *local_30;
  
  bVar1 = cmGeneratorTarget::IsDLLPlatform((cmGeneratorTarget *)this);
  if (bVar1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_70,(GeneratorExpressionContent *)context);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,
               "TARGET_SONAME_IMPORT_FILE is not allowed for DLL target platforms.","");
    reportError((cmGeneratorExpressionContext *)target,&local_70,&local_e8);
  }
  else {
    TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this);
    if (TVar2 == SHARED_LIBRARY) {
      config = &(target->LinkOptionsCache)._M_t._M_impl.super__Rb_tree_header;
      bVar1 = cmGeneratorTarget::HasImportLibrary((cmGeneratorTarget *)this,(string *)config);
      if (bVar1) {
        cmGeneratorTarget::GetDirectory
                  (&local_90,(cmGeneratorTarget *)this,(string *)config,ImportLibraryArtifact);
        cmGeneratorTarget::GetSOName
                  (&local_b0,(cmGeneratorTarget *)this,(string *)config,ImportLibraryArtifact);
        local_70._M_dataplus._M_p = (pointer)local_90._M_string_length;
        local_70._M_string_length = (size_type)local_90._M_dataplus._M_p;
        local_e8.field_2._M_allocated_capacity = (long)&local_e8.field_2 + 8;
        local_e8._M_dataplus._M_p = (pointer)0x0;
        local_e8._M_string_length = 1;
        local_e8.field_2._M_local_buf[8] = '/';
        local_70.field_2._8_8_ = 1;
        local_48 = 0;
        local_40 = local_b0._M_string_length;
        local_38 = local_b0._M_dataplus._M_p;
        views._M_len = 3;
        views._M_array = (iterator)&local_70;
        local_70.field_2._M_allocated_capacity = (size_type)&local_90;
        local_50 = (undefined1 *)local_e8.field_2._M_allocated_capacity;
        local_30 = &local_b0;
        cmCatViews(__return_storage_ptr__,views);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p == &local_90.field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
      goto LAB_003f890e;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_70,(GeneratorExpressionContent *)context);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"TARGET_SONAME_IMPORT_FILE is allowed only for SHARED libraries."
               ,"");
    reportError((cmGeneratorExpressionContext *)target,&local_70,&local_e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_003f890e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context,
                            const GeneratorExpressionContent* content)
  {
    // The target soname file (.so.1).
    if (target->IsDLLPlatform()) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_SONAME_IMPORT_FILE is not allowed "
                    "for DLL target platforms.");
      return std::string();
    }
    if (target->GetType() != cmStateEnums::SHARED_LIBRARY) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_SONAME_IMPORT_FILE is allowed only for "
                    "SHARED libraries.");
      return std::string();
    }

    if (target->HasImportLibrary(context->Config)) {
      return cmStrCat(target->GetDirectory(
                        context->Config, cmStateEnums::ImportLibraryArtifact),
                      '/',
                      target->GetSOName(context->Config,
                                        cmStateEnums::ImportLibraryArtifact));
    }
    return std::string{};
  }